

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O2

bool check_entwine(CHAR_DATA *ch,int type)

{
  AFFECT_DATA *pAVar1;
  
  pAVar1 = (AFFECT_DATA *)&ch->affected;
  do {
    while( true ) {
      pAVar1 = pAVar1->next;
      if (pAVar1 == (AFFECT_DATA *)0x0) goto LAB_00379e7c;
      if (type == 2) break;
      if (type == 1) {
        if ((pAVar1->type == gsn_entwine) && (pAVar1->modifier == 1)) goto LAB_00379e7c;
      }
      else if ((type == 0) && ((pAVar1->type == gsn_entwine && (pAVar1->modifier == 0))))
      goto LAB_00379e7c;
    }
  } while ((pAVar1->type != gsn_entwine) || (pAVar1->location != 2));
LAB_00379e7c:
  return pAVar1 != (AFFECT_DATA *)0x0;
}

Assistant:

bool check_entwine(CHAR_DATA *ch, int type)
{
	for (AFFECT_DATA *af = ch->affected; af != nullptr; af = af->next)
	{
		if (type == 0 && af->type == gsn_entwine && af->modifier == 0)
			return true;
		else if (type == 1 && af->type == gsn_entwine && af->modifier == 1)
			return true;
		else if (type == 2 && af->type == gsn_entwine && af->location == APPLY_DEX)
			return true;
	}

	return false;
}